

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall HighsLpRelaxation::performAging(HighsLpRelaxation *this,bool deleteRows)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  HighsMipSolver *pHVar4;
  pointer pLVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  HighsInt ndelcuts;
  double dVar12;
  vector<int,_std::allocator<int>_> deletemask;
  int local_68;
  vector<int,_std::allocator<int>_> local_58;
  long local_40;
  long local_38;
  
  if ((((this->lpsolver).info_.super_HighsInfoStruct.basis_validity != 0) &&
      (dVar12 = (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility,
      pHVar4 = this->mipsolver,
      pdVar1 = &((pHVar4->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol,
      dVar12 < *pdVar1 || dVar12 == *pdVar1)) && ((this->lpsolver).solution_.dual_valid == true)) {
    if (deleteRows) {
      iVar2 = (pHVar4->options_mip_->super_HighsOptionsStruct).mip_lp_age_limit;
      uVar6 = this->epochs + 1;
      this->epochs = uVar6;
      uVar9 = 2;
      if (2 < iVar2 >> 1) {
        uVar9 = (ulong)(uint)(iVar2 >> 1);
      }
      local_68 = 0x7fffffff;
      if ((uVar6 % uVar9 == 0) && (local_68 = (int)uVar6, iVar2 < (int)uVar6)) {
        local_68 = iVar2;
      }
    }
    else {
      local_68 = 0x7fffffff;
      if (this->lastAgeCall == this->numlpiters) {
        return;
      }
    }
    this->lastAgeCall = this->numlpiters;
    iVar2 = (this->lpsolver).model_.lp_.num_row_;
    iVar3 = pHVar4->model_->num_row_;
    lVar10 = (long)iVar3;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ndelcuts = 0;
    if (iVar2 != iVar3) {
      local_40 = lVar10 * 4;
      lVar11 = lVar10 * 0xc;
      local_38 = lVar10 * 8;
      lVar8 = 0;
      ndelcuts = 0;
      do {
        if ((this->lpsolver).basis_.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8 + lVar10] == kBasic) {
          pLVar5 = (this->lprows).
                   super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar7 = *(int *)((long)&pLVar5->age + lVar11);
          iVar7 = (uint)(iVar7 != 0 || deleteRows) + iVar7;
          *(int *)((long)&pLVar5->age + lVar11) = iVar7;
          if (local_68 < iVar7) {
            if (ndelcuts == 0) {
              std::vector<int,_std::allocator<int>_>::resize(&local_58,(long)iVar2);
              pLVar5 = (this->lprows).
                       super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            *(undefined4 *)
             ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar8 * 4 + local_40) = 1;
            HighsCutPool::lpCutRemoved
                      (&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                       *(HighsInt *)((long)&pLVar5->index + lVar11));
            ndelcuts = ndelcuts + 1;
          }
        }
        else {
          dVar12 = ABS(*(double *)
                        ((long)(this->lpsolver).solution_.row_dual.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar8 * 8 + local_38));
          pdVar1 = &(this->lpsolver).options_.super_HighsOptionsStruct.dual_feasibility_tolerance;
          if (*pdVar1 <= dVar12 && dVar12 != *pdVar1) {
            *(undefined4 *)
             ((long)&((this->lprows).
                      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                      ._M_impl.super__Vector_impl_data._M_start)->age + lVar11) = 0;
          }
        }
        lVar11 = lVar11 + 0xc;
        lVar8 = lVar8 + 1;
      } while (iVar2 - iVar3 != (int)lVar8);
    }
    removeCuts(this,ndelcuts,&local_58);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsLpRelaxation::performAging(bool deleteRows) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt agelimit;

  if (lpsolver.getInfo().basis_validity == kBasisValidityInvalid ||
      lpsolver.getInfo().max_dual_infeasibility > mipsolver.mipdata_->feastol ||
      !lpsolver.getSolution().dual_valid)
    return;

  if (deleteRows) {
    agelimit = mipsolver.options_mip_->mip_lp_age_limit;

    ++epochs;
    if (epochs % std::max(agelimit >> 1, HighsInt{2}) != 0)
      agelimit = kHighsIInf;
    else if ((HighsInt)epochs < agelimit)
      agelimit = epochs;
  } else {
    if (lastAgeCall == numlpiters) return;
    agelimit = kHighsIInf;
  }

  lastAgeCall = numlpiters;

  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      lprows[i].age += (deleteRows || lprows[i].age != 0);
      if (lprows[i].age > agelimit) {
        if (ndelcuts == 0) deletemask.resize(nlprows);
        ++ndelcuts;
        deletemask[i] = 1;
        mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
      }
    } else if (std::abs(lpsolver.getSolution().row_dual[i]) >
               lpsolver.getOptions().dual_feasibility_tolerance) {
      lprows[i].age = 0;
    }
  }

  removeCuts(ndelcuts, deletemask);
}